

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_unstable.cpp
# Opt level: O2

void merge_2way_unstable(uchar **from0,size_t n0,uchar **from1,size_t n1,uchar **result)

{
  uint __line;
  char cVar1;
  int iVar2;
  uchar *puVar3;
  char *__assertion;
  uchar *puVar4;
  long lVar5;
  uchar **local_40;
  uchar **local_38;
  
LAB_001c177e:
  puVar3 = *from1;
  puVar4 = *from0;
  iVar2 = cmp(puVar4,puVar3);
  local_40 = from1;
  local_38 = from0;
  if (0 < iVar2) goto LAB_001c179d;
  if (iVar2 != 0) {
LAB_001c181b:
    lVar5 = 0;
    do {
      iVar2 = cmp(puVar4,puVar3);
      if (-1 < iVar2) {
        __assertion = "cmp(key0, key1) < 0";
        __line = 0x52;
        goto LAB_001c196b;
      }
      *(uchar **)((long)result + lVar5) = puVar4;
      local_40 = from1;
      if (n0 == 1) {
        result = (uchar **)((long)result + lVar5 + 8);
        goto LAB_001c18fe;
      }
      puVar4 = *(uchar **)((long)local_38 + lVar5 + 8);
      iVar2 = cmp(puVar4,puVar3);
      lVar5 = lVar5 + 8;
      n0 = n0 - 1;
      switch(iVar2 == 0) {
      case false:
        goto switchD_001c1880_caseD_0;
      case true:
        result = (uchar **)((long)result + lVar5);
        local_38 = (uchar **)((long)local_38 + lVar5);
        goto LAB_001c189c;
      }
    } while( true );
  }
  goto LAB_001c189c;
switchD_001c1880_caseD_0:
  result = (uchar **)((long)result + lVar5);
  local_38 = (uchar **)((long)local_38 + lVar5);
LAB_001c179d:
  lVar5 = 0;
  do {
    iVar2 = cmp(puVar3,puVar4);
    if (-1 < iVar2) {
      __assertion = "cmp(key1, key0) < 0";
      __line = 0x5f;
      goto LAB_001c196b;
    }
    *(uchar **)((long)result + lVar5) = puVar3;
    if (n1 == 1) {
      if (n0 == 0) {
        return;
      }
      result = (uchar **)((long)result + lVar5 + 8);
      local_40 = local_38;
      goto LAB_001c1912;
    }
    puVar3 = *(uchar **)((long)local_40 + lVar5 + 8);
    iVar2 = cmp(puVar3,puVar4);
    cVar1 = (iVar2 != 0) * '\x05';
    if (iVar2 < 0) {
      cVar1 = '\x03';
    }
    lVar5 = lVar5 + 8;
    n1 = n1 - 1;
  } while (cVar1 == '\x03');
  result = (uchar **)((long)result + lVar5);
  if (cVar1 == '\0') goto code_r0x001c17f9;
  from1 = (uchar **)((long)local_40 + lVar5);
  goto LAB_001c181b;
code_r0x001c17f9:
  from1 = (uchar **)((long)local_40 + lVar5);
LAB_001c189c:
  iVar2 = cmp(puVar4,puVar3);
  if (iVar2 != 0) {
    __assertion = "cmp(key0, key1) == 0";
    __line = 0x6c;
LAB_001c196b:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_unstable.cpp"
                  ,__line,
                  "void merge_2way_unstable(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                 );
  }
  *result = puVar4;
  result[1] = puVar3;
  result = result + 2;
  from1 = from1 + 1;
  n1 = n1 - 1;
  n0 = n0 - 1;
  local_40 = from1;
  if (n0 == 0) {
LAB_001c18fe:
    n0 = n1;
    if (n1 == 0) {
      return;
    }
    goto LAB_001c1912;
  }
  from0 = local_38 + 1;
  local_40 = from0;
  if (n1 == 0) {
LAB_001c1912:
    memcpy(result,local_40,n0 << 3);
    return;
  }
  goto LAB_001c177e;
}

Assistant:

static void
merge_2way_unstable(unsigned char** restrict from0, size_t n0,
                    unsigned char** restrict from1, size_t n1,
                    unsigned char** restrict result)
{
	debug()<<__func__<<"(), n0="<<n0<<", n1="<<n1<<"\n";
	unsigned char* key0 = *from0;
	unsigned char* key1 = *from1;
initial:
	const int cmp01 = cmp(key0, key1);
	if (cmp01 > 0)  goto state_1lt0;
	if (cmp01 == 0) goto state_0eq1;
	// Fall through.
state_0lt1:
{
	debug() << "\tstate_0lt1\n";
	assert(cmp(key0, key1) <  0);
	*result++ = key0;
	if (--n0 == 0) goto finish0;
	++from0;
	key0 = *from0;
	const int cmp_0_1 = cmp(key0, key1);
	if (cmp_0_1 <  0) goto state_0lt1;
	if (cmp_0_1 == 0) goto state_0eq1;
	// Fall through.
}
state_1lt0:
{
	debug() << "\tstate_1lt0\n";
	assert(cmp(key1, key0) <  0);
	*result++ = key1;
	if (--n1 == 0) goto finish1;
	++from1;
	key1 = *from1;
	const int cmp_1_0 = cmp(key1, key0);
	if (cmp_1_0 < 0) goto state_1lt0;
	if (cmp_1_0 > 0) goto state_0lt1;
	// Fall through.
}
state_0eq1:
{
	debug() << "\tstate_0eq1\n";
	assert(cmp(key0, key1) == 0);
	*result++ = key0;
	*result++ = key1;
	++from0;
	++from1;
	--n0;
	--n1;
	if (n0 == 0) goto finish0;
	if (n1 == 0) goto finish1;
	key0 = *from0;
	key1 = *from1;
	goto initial;
}
finish0:
	assert(n0==0);
	if (n1) (void) memcpy(result, from1, n1*sizeof(unsigned char*));
	debug()<< "~" << __func__ << "\n";
	return;
finish1:
	assert(n1==0);
	if (n0) (void) memcpy(result, from0, n0*sizeof(unsigned char*));
	debug()<< "~" << __func__ << "\n";
	return;
}